

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O0

int cmd_help(char *arg)

{
  int iVar1;
  char *__s;
  char *__s1;
  char *cmd;
  char *args;
  int i;
  char *arg_local;
  
  __s = strdup(arg);
  strtok(__s," ");
  __s1 = strtok((char *)0x0," ");
  if (__s1 != (char *)0x0) {
    args._4_4_ = 0;
    while ((commands[args._4_4_].name != (char *)0x0 &&
           (iVar1 = strcmp(__s1,commands[args._4_4_].name), iVar1 != 0))) {
      args._4_4_ = args._4_4_ + 1;
    }
    if (commands[args._4_4_].name != (char *)0x0) {
      if (commands[args._4_4_].help_func == (_func_void *)0x0) {
        printf("%s\n",commands[args._4_4_].helpstring);
      }
      else {
        (*commands[args._4_4_].help_func)();
      }
      goto LAB_0010b361;
    }
    printf("Unknown command \'%s\'\n",__s1);
  }
  fprintf(_stdout,"Available commands:\n");
  args._4_4_ = 0;
  while (commands[args._4_4_].name != (char *)0x0) {
    if (commands[args._4_4_].helpstring != (char *)0x0) {
      fprintf(_stdout,"  %-15s %s\n",commands[args._4_4_].name,commands[args._4_4_].helpstring);
    }
    args._4_4_ = args._4_4_ + 1;
  }
LAB_0010b361:
  free(__s);
  return 0;
}

Assistant:

int
cmd_help(const char *arg)
{
    int i;
    char *args = strdup(arg);
    char *cmd = NULL;

    strtok(args, " ");
    if ((cmd = strtok(NULL, " ")) == NULL) {

generic_help:
        fprintf(stdout, "Available commands:\n");

        for (i = 0; commands[i].name; i++) {
            if (commands[i].helpstring != NULL) {
                fprintf(stdout, "  %-15s %s\n", commands[i].name, commands[i].helpstring);
            }
        }
    } else {
        /* print specific help for the selected command */

        /* get the command of the specified name */
        for (i = 0; commands[i].name; i++) {
            if (strcmp(cmd, commands[i].name) == 0) {
                break;
            }
        }

        /* execute the command's help if any valid command specified */
        if (commands[i].name) {
            if (commands[i].help_func != NULL) {
                commands[i].help_func();
            } else {
                printf("%s\n", commands[i].helpstring);
            }
        } else {
            /* if unknown command specified, print the list of commands */
            printf("Unknown command \'%s\'\n", cmd);
            goto generic_help;
        }
    }

    free(args);
    return 0;
}